

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O1

void __thiscall
google::protobuf::io::Printer::Sub::
Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateClassData(google::protobuf::io::Printer*)::__4_const&>
          (Sub *this,string *key,anon_class_16_2_fd512ddd_for_cb_conflict1 *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  Printer **ppPVar5;
  undefined8 *puVar6;
  
  paVar1 = &(this->key_).field_2;
  (this->key_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (key->_M_dataplus)._M_p;
  paVar2 = &key->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&key->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->key_).field_2 + 8) = uVar4;
  }
  else {
    (this->key_)._M_dataplus._M_p = pcVar3;
    (this->key_).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->key_)._M_string_length = key->_M_string_length;
  (key->_M_dataplus)._M_p = (pointer)paVar2;
  key->_M_string_length = 0;
  (key->field_2)._M_local_buf[0] = '\0';
  puVar6 = (undefined8 *)operator_new(0x18);
  ppPVar5 = value->p;
  *puVar6 = value->this;
  puVar6[1] = ppPVar5;
  *(undefined1 *)(puVar6 + 2) = 0;
  *(undefined8 *)
   ((long)&(this->value_).value.
           super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
           .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
           super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
           super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
           super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_> + 0x10)
       = 0;
  *(undefined8 *)
   &(this->value_).value.
    super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
    .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
    super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
    super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
    super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
    super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_> = 0;
  *(undefined8 *)
   ((long)&(this->value_).value.
           super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
           .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
           super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
           super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
           super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_> + 8) =
       0;
  *(code **)((long)&(this->value_).value.
                    super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                    .
                    super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                    .
                    super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                    .
                    super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                    .
                    super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
            + 0x18) =
       std::
       _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
       ::_M_invoke;
  *(undefined8 **)
   &(this->value_).value.
    super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
    .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
    super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
    super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
    super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
    super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_> = puVar6
  ;
  *(undefined8 *)
   ((long)&(this->value_).value.
           super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
           .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
           super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
           super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
           super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_> + 8) =
       0;
  *(code **)((long)&(this->value_).value.
                    super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                    .
                    super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                    .
                    super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                    .
                    super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                    .
                    super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
            + 0x10) =
       std::
       _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
       ::_M_manager;
  *(__index_type *)
   ((long)&(this->value_).value.
           super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
           .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
           super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
           super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
           super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_> + 0x20)
       = '\x01';
  (this->value_).consume_after._M_dataplus._M_p = (pointer)&(this->value_).consume_after.field_2;
  (this->value_).consume_after._M_string_length = 0;
  (this->value_).consume_after.field_2._M_local_buf[0] = '\0';
  (this->value_).consume_parens_if_empty = false;
  std::__cxx11::string::_M_replace((ulong)&(this->value_).consume_after,0,(char *)0x0,0x53a374);
  (this->annotation_).
  super__Optional_base<google::protobuf::io::Printer::AnnotationRecord,_false,_false>._M_payload.
  super__Optional_payload<google::protobuf::io::Printer::AnnotationRecord,_true,_false,_false>.
  super__Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>._M_engaged = false;
  return;
}

Assistant:

Sub(std::string key, Value&& value)
      : key_(std::move(key)),
        value_(std::forward<Value>(value)),
        annotation_(absl::nullopt) {}